

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *window,ImGuiAxis axis)

{
  undefined8 uVar1;
  float *pfVar2;
  uint in_ESI;
  long in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [56];
  undefined1 auVar3 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar6 [56];
  undefined1 auVar5 [64];
  ImRect IVar7;
  float scrollbar_size;
  float border_size;
  ImRect inner_rect;
  ImRect outer_rect;
  float y2;
  undefined8 uVar8;
  float x1;
  undefined4 uVar9;
  float lhs;
  undefined4 uStack_28;
  undefined4 local_24;
  undefined4 uStack_20;
  undefined1 local_10 [16];
  
  auVar6 = in_ZMM1._8_56_;
  auVar4 = in_ZMM0._8_56_;
  IVar7 = ImGuiWindow::Rect((ImGuiWindow *)0x468777);
  auVar5._0_8_ = IVar7.Max;
  auVar5._8_56_ = auVar6;
  auVar3._0_8_ = IVar7.Min;
  auVar3._8_56_ = auVar4;
  uVar1 = vmovlpd_avx(auVar3._0_16_);
  lhs = (float)uVar1;
  uStack_28 = (float)((ulong)uVar1 >> 0x20);
  uVar1 = vmovlpd_avx(auVar5._0_16_);
  uVar8 = *(undefined8 *)(in_RDI + 0x228);
  x1 = (float)*(undefined8 *)(in_RDI + 0x230);
  uVar9 = (undefined4)((ulong)*(undefined8 *)(in_RDI + 0x230) >> 0x20);
  y2 = *(float *)(in_RDI + 0x44);
  pfVar2 = ImVec2::operator[]((ImVec2 *)(in_RDI + 0x74),(long)(int)(in_ESI ^ 1));
  if (in_ESI == 0) {
    uStack_20 = (float)((ulong)uVar1 >> 0x20);
    ImMax<float>(uStack_28,(uStack_20 - y2) - *pfVar2);
    ImRect::ImRect((ImRect *)CONCAT44(lhs,uVar9),x1,(float)((ulong)uVar8 >> 0x20),(float)uVar8,y2);
  }
  else {
    local_24 = (float)uVar1;
    ImMax<float>(lhs,(local_24 - y2) - *pfVar2);
    ImRect::ImRect((ImRect *)CONCAT44(lhs,uVar9),x1,(float)((ulong)uVar8 >> 0x20),(float)uVar8,y2);
  }
  return (ImRect)local_10;
}

Assistant:

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow* window, ImGuiAxis axis)
{
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1]; // (ScrollbarSizes.x = width of Y scrollbar; ScrollbarSizes.y = height of X scrollbar)
    IM_ASSERT(scrollbar_size > 0.0f);
    if (axis == ImGuiAxis_X)
        return ImRect(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size), inner_rect.Max.x, outer_rect.Max.y);
    else
        return ImRect(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y, outer_rect.Max.x, inner_rect.Max.y);
}